

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Wec_t * Vec_WecCreateClasses(Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Wec_t *p;
  undefined4 local_1c;
  int Entry;
  int i;
  Vec_Wec_t *vClasses;
  Vec_Int_t *vMap_local;
  
  iVar1 = Vec_IntFindMax(vMap);
  p = Vec_WecStart(iVar1 + 1);
  for (local_1c = 0; iVar1 = Vec_IntSize(vMap), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(vMap,local_1c);
    Vec_WecPush(p,iVar1,local_1c);
  }
  return p;
}

Assistant:

static inline Vec_Wec_t * Vec_WecCreateClasses( Vec_Int_t * vMap )
{
    Vec_Wec_t * vClasses;
    int i, Entry;
    vClasses = Vec_WecStart( Vec_IntFindMax(vMap) + 1 );
    Vec_IntForEachEntry( vMap, Entry, i )
        Vec_WecPush( vClasses, Entry, i );
    return vClasses;
}